

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O3

uint8_t * __thiscall
BTree<NodeBTree,_NodeKey>::searchWithComparison
          (BTree<NodeBTree,_NodeKey> *this,SearchResult *result,uint8_t *data,uint count,
          NodeKey *key,KeyCompareOp compOp)

{
  uint uVar1;
  int iVar2;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  ushort uVar7;
  uint uVar8;
  uint8_t *puVar9;
  uint uVar10;
  code *in_stack_00000008;
  long in_stack_00000010;
  
  uVar7 = swap_bytes(*(undefined2 *)data);
  uVar10 = (uVar7 & 0x7ff0) >> 4;
  result->upperBound = uVar10;
  if (uVar10 == 0) {
    uVar10 = 0;
    uVar5 = 0;
  }
  else {
    plVar6 = (long *)((long)&this->m_data + in_stack_00000010);
    uVar4 = 0;
    do {
      pcVar3 = in_stack_00000008;
      if (((ulong)in_stack_00000008 & 1) != 0) {
        pcVar3 = *(code **)(in_stack_00000008 + *plVar6 + -1);
      }
      uVar8 = uVar10 - uVar4 >> 1;
      uVar5 = uVar8 + uVar4;
      uVar7 = swap_bytes(*(undefined2 *)(data + ((uVar5 * 4 + 4) * 3 >> 3)));
      iVar2 = (*pcVar3)(plVar6,key,data + (uVar7 >> ((char)uVar5 * '\x04' & 4U) & 0xfff));
      if (iVar2 == 0) {
        result->lowerBound = uVar5;
        result->index = uVar5;
        return data + (uVar7 >> ((char)uVar5 * '\x04' & 4U) & 0xfff);
      }
      uVar8 = uVar8 + 1 + uVar4;
      uVar1 = uVar8;
      if (iVar2 < 1) {
        uVar10 = uVar5;
        uVar1 = uVar4;
      }
      uVar4 = uVar1;
    } while (uVar4 < uVar10);
    if (0 < iVar2) {
      uVar5 = uVar8;
    }
    uVar10 = result->upperBound;
  }
  result->lowerBound = uVar5;
  result->index = 0xffffffff;
  puVar9 = (uint8_t *)0x0;
  if ((count != 0) && (uVar5 != uVar10)) {
    uVar7 = swap_bytes(*(undefined2 *)(data + (uVar5 * 0xc + 0xc >> 3)));
    puVar9 = data + (uVar7 >> ((byte)(uVar5 << 2) & 4) & 0xfff);
  }
  return puVar9;
}

Assistant:

const uint8_t* searchWithComparison(SearchResult& result, const uint8_t* data, unsigned int count, const Key& key, KeyCompareOp compOp) const
	{
		const auto& self = static_cast<const Derived&>(*this);

		auto high = getBitsAt(data, 0) & UINT32_C(0x7FF), low = 0u;
		auto index = 0u;
		const uint8_t* subData;
		
		result.upperBound = high;

		while (low < high) {
			const auto mid = low + (high - low) / 2;
			index = mid + 1;

			const auto offset = getBitsAt(data, index);
			subData = advancePointer(data, offset);

			const auto ret = (self.*compOp)(key, subData);
			if (ret == 0) {
				result.lowerBound = mid;
				result.index = mid;
				goto done;
			} else if (ret > 0) {
				low = index;
			} else if (ret < 0) {
				high = mid;
				index = mid;
			}
		}
		
		subData = nullptr;

		result.lowerBound = index;
		result.index = INVALID_INDEX;
		
		if (count != 0 && index != result.upperBound) {
			const auto offset = getBitsAt(data, index + 1);
			subData = advancePointer(data, offset);
		}
		
	done:
		return subData;
	}